

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O0

void __thiscall cmExportSet::~cmExportSet(cmExportSet *this)

{
  cmExportSet *this_local;
  
  std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>::
  ~vector(&this->Installations);
  std::__cxx11::string::~string((string *)&this->Name);
  std::
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  ::~vector(&this->TargetExports);
  return;
}

Assistant:

cmExportSet::~cmExportSet() = default;